

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

ostream * jsonnet::internal::operator<<(ostream *o,Kind v)

{
  char *__s;
  size_t sVar1;
  
  __s = Token::toString(v);
  if (__s == (char *)0x0) {
    std::ios::clear((int)o + (int)*(undefined8 *)(*(long *)o + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(o,__s,sVar1);
  }
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, Token::Kind v)
{
    o << Token::toString(v);
    return o;
}